

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::LoadableStateIncrement
          (ChElementHexaANCF_3843 *this,uint off_x,ChState *x_new,ChState *x,uint off_v,
          ChStateDelta *Dv)

{
  element_type *peVar1;
  
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->super_ChNodeFEAxyzDD + 0xa8))();
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzDD + 0xa8))
            (peVar1,off_x + 0xc,x_new,x,off_v + 0xc,Dv);
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzDD + 0xa8))
            (peVar1,off_x + 0x18,x_new,x,off_v + 0x18,Dv);
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzDD + 0xa8))
            (peVar1,off_x + 0x24,x_new,x,off_v + 0x24,Dv);
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzDD + 0xa8))
            (peVar1,off_x + 0x30,x_new,x,off_v + 0x30,Dv);
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzDD + 0xa8))
            (peVar1,off_x + 0x3c,x_new,x,off_v + 0x3c,Dv);
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzDD + 0xa8))
            (peVar1,off_x + 0x48,x_new,x,off_v + 0x48,Dv);
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[7].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzDD + 0xa8))
            (peVar1,off_x + 0x54,x_new,x,off_v + 0x54,Dv);
  return;
}

Assistant:

void ChElementHexaANCF_3843::LoadableStateIncrement(const unsigned int off_x,
                                                    ChState& x_new,
                                                    const ChState& x,
                                                    const unsigned int off_v,
                                                    const ChStateDelta& Dv) {
    m_nodes[0]->NodeIntStateIncrement(off_x, x_new, x, off_v, Dv);
    m_nodes[1]->NodeIntStateIncrement(off_x + 12, x_new, x, off_v + 12, Dv);
    m_nodes[2]->NodeIntStateIncrement(off_x + 24, x_new, x, off_v + 24, Dv);
    m_nodes[3]->NodeIntStateIncrement(off_x + 36, x_new, x, off_v + 36, Dv);
    m_nodes[4]->NodeIntStateIncrement(off_x + 48, x_new, x, off_v + 48, Dv);
    m_nodes[5]->NodeIntStateIncrement(off_x + 60, x_new, x, off_v + 60, Dv);
    m_nodes[6]->NodeIntStateIncrement(off_x + 72, x_new, x, off_v + 72, Dv);
    m_nodes[7]->NodeIntStateIncrement(off_x + 84, x_new, x, off_v + 84, Dv);
}